

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

void Bac_ManAssignInternWordNames(Bac_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *vMap;
  int *__s;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  uVar2 = p->nNtks;
  if ((int)uVar2 < 1) {
    uVar6 = 0;
  }
  else {
    lVar3 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + *(int *)((long)&p->pNtks[1].vType.nSize + lVar3);
      lVar3 = lVar3 + 0xd0;
    } while ((ulong)uVar2 * 0xd0 - lVar3 != 0);
    uVar6 = iVar5 * 2;
  }
  vMap = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0xe < uVar6 - 1) {
    uVar1 = uVar6;
  }
  vMap->nCap = uVar1;
  if (uVar1 == 0) {
    vMap->pArray = (int *)0x0;
    vMap->nSize = uVar6;
  }
  else {
    __s = (int *)malloc((long)(int)uVar1 << 2);
    vMap->pArray = __s;
    vMap->nSize = uVar6;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)(int)uVar6 << 2);
      goto LAB_003bb53c;
    }
  }
  __s = (int *)0x0;
LAB_003bb53c:
  if (0 < (int)uVar2) {
    lVar7 = 0xd0;
    lVar3 = 0;
    do {
      Bac_ManAssignInternWordNamesNtk((Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar7),vMap);
      lVar3 = lVar3 + 1;
      lVar7 = lVar7 + 0xd0;
    } while (lVar3 < p->nNtks);
  }
  if ((int)uVar6 < 1) {
    uVar2 = 0;
  }
  else {
    uVar4 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 + (__s[uVar4] == 0);
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
  }
  if (uVar2 != uVar6) {
    __assert_fail("Vec_IntCountEntry(vMap, 0) == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0x18e,"void Bac_ManAssignInternWordNames(Bac_Man_t *)");
  }
  if (__s != (int *)0x0) {
    free(__s);
  }
  free(vMap);
  return;
}

Assistant:

void Bac_ManAssignInternWordNames( Bac_Man_t * p )
{
    Vec_Int_t * vMap = Vec_IntStart( 2*Bac_ManObjNum(p) );
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_ManAssignInternWordNamesNtk( pNtk, vMap );
    assert( Vec_IntCountEntry(vMap, 0) == Vec_IntSize(vMap) );
    Vec_IntFree( vMap );
}